

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  pointer pBVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  pointer pBVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  undefined4 *puVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  undefined4 *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long in_FS_OFFSET;
  bool bVar15;
  byte bVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_488 [32];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [13];
  undefined3 uStack_41b;
  int iStack_418;
  bool bStack_414;
  undefined8 local_410;
  int *local_400;
  cpp_dec_float<200U,_int,_void> *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [13];
  undefined3 uStack_37b;
  int iStack_378;
  bool bStack_374;
  undefined8 local_370;
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [13];
  undefined3 uStack_2fb;
  int iStack_2f8;
  bool bStack_2f4;
  undefined8 local_2f0;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_2e8;
  int *local_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [13];
  undefined3 uStack_26b;
  int iStack_268;
  bool bStack_264;
  undefined8 local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [13];
  undefined3 uStack_1eb;
  int iStack_1e8;
  bool abStack_1e4 [12];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  undefined8 local_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar16 = 0;
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x1c;
  local_2d8._0_16_ = (undefined1  [16])0x0;
  local_2d8._16_16_ = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = SUB1613((undefined1  [16])0x0,0);
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  local_2f0._0_4_ = cpp_dec_float_finite;
  local_2f0._4_4_ = 0x1c;
  local_368._0_16_ = (undefined1  [16])0x0;
  local_368._16_16_ = (undefined1  [16])0x0;
  local_348 = (undefined1  [16])0x0;
  local_338 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = SUB1613((undefined1  [16])0x0,0);
  uStack_2fb = 0;
  iStack_2f8 = 0;
  bStack_2f4 = false;
  local_400 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    local_410._0_4_ = cpp_dec_float_finite;
    local_410._4_4_ = 0x1c;
    local_488._0_16_ = (undefined1  [16])0x0;
    local_488._16_16_ = (undefined1  [16])0x0;
    local_468 = (undefined1  [16])0x0;
    local_458 = (undefined1  [16])0x0;
    local_448 = (undefined1  [16])0x0;
    local_438 = (undefined1  [16])0x0;
    local_428 = SUB1613((undefined1  [16])0x0,0);
    uStack_41b = 0;
    iStack_418 = 0;
    bStack_414 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_488,*(double *)(in_FS_OFFSET + -8));
  }
  else {
    iVar5 = *minIdx;
    pBVar1 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar8 = pBVar1 + iVar5;
    puVar10 = (undefined4 *)local_488;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar10 = *(undefined4 *)&(pBVar8->val).m_backend;
      pBVar8 = (pointer)((long)&(pBVar8->val).m_backend + 4);
      puVar10 = puVar10 + 1;
    }
    iStack_418 = *(int *)((long)&pBVar1[iVar5].val.m_backend + 0x70);
    bStack_414 = *(bool *)((long)&pBVar1[iVar5].val.m_backend + 0x74);
    local_410 = *(undefined8 *)((long)&pBVar1[iVar5].val.m_backend + 0x78);
  }
  puVar10 = (undefined4 *)local_488;
  puVar13 = (undefined4 *)local_2d8;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar13 = *puVar10;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
  }
  iStack_268 = iStack_418;
  bStack_264 = bStack_414;
  local_260._0_4_ = (fpclass_type)local_410;
  local_260._4_4_ = local_410._4_4_;
  if (0 < nnz) {
    local_2e0 = idx + nnz;
    local_3f0 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).epsilon;
    local_158 = *(double *)(in_FS_OFFSET + -8);
    uStack_150 = 0;
    local_148 = -local_158;
    uStack_140 = 0x8000000000000000;
    local_3f8 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend;
    local_2e8 = &this->breakpoints;
    do {
      iVar5 = *idx;
      pnVar9 = upd + iVar5;
      pcVar11 = &local_130;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar16 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
      }
      local_130.exp = upd[iVar5].m_backend.exp;
      local_130.neg = upd[iVar5].m_backend.neg;
      uVar2._0_4_ = upd[iVar5].m_backend.fpclass;
      uVar2._4_4_ = upd[iVar5].m_backend.prec_elem;
      pnVar9 = local_3f0;
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_488;
      local_130._120_8_ = uVar2;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + (ulong)bVar16 * -8 + 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
      }
      iStack_418 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.exp;
      bStack_414 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.neg;
      local_410._0_4_ =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_410._4_4_ =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (((fpclass_type)local_410 == cpp_dec_float_NaN || (fpclass_type)uVar2 == cpp_dec_float_NaN)
         || (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_130,(cpp_dec_float<200U,_int,_void> *)local_488), iVar4 < 1))
      {
        pnVar9 = local_3f0;
        puVar12 = (uint *)local_488;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar12 = (pnVar9->m_backend).data._M_elems[0];
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + (ulong)bVar16 * -8 + 4);
          puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
        }
        iStack_418 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).epsilon.m_backend.exp;
        bStack_414 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).epsilon.m_backend.neg;
        local_410._0_4_ =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.fpclass;
        local_410._4_4_ =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.prec_elem;
        if (local_488._0_4_ != 0 || (fpclass_type)local_410 != cpp_dec_float_finite) {
          bStack_414 = (bool)(bStack_414 ^ 1);
        }
        if ((((fpclass_type)local_410 != cpp_dec_float_NaN) &&
            (local_130.fpclass != cpp_dec_float_NaN)) &&
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_130,(cpp_dec_float<200U,_int,_void> *)local_488), iVar4 < 0))
        {
          ::soplex::infinity::__tls_init();
          pcVar11 = &upp[iVar5].m_backend;
          local_410._0_4_ = cpp_dec_float_finite;
          local_410._4_4_ = 0x1c;
          local_488._0_16_ = (undefined1  [16])0x0;
          local_488._16_16_ = (undefined1  [16])0x0;
          local_468 = (undefined1  [16])0x0;
          local_458 = (undefined1  [16])0x0;
          local_448 = (undefined1  [16])0x0;
          local_438 = (undefined1  [16])0x0;
          local_428 = SUB1613((undefined1  [16])0x0,0);
          uStack_41b = 0;
          iStack_418 = 0;
          bStack_414 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_488,local_158);
          if (((pcVar11->fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_410 != cpp_dec_float_NaN)) &&
             (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar11,(cpp_dec_float<200U,_int,_void> *)local_488), iVar4 < 0)) {
            local_370._0_4_ = cpp_dec_float_finite;
            local_370._4_4_ = 0x1c;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (undefined1  [16])0x0;
            local_398 = (undefined1  [16])0x0;
            local_388 = SUB1613((undefined1  [16])0x0,0);
            uStack_37b = 0;
            iStack_378 = 0;
            bStack_374 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_3e8 == &vec[iVar5].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_3e8,pcVar11);
              if (local_3e8._0_4_ != 0 || (fpclass_type)local_370 != cpp_dec_float_finite) {
                bStack_374 = (bool)(bStack_374 ^ 1);
              }
            }
            else {
              if ((cpp_dec_float<200U,_int,_void> *)local_3e8 != pcVar11) {
                pcVar7 = pcVar11;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
                for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                  (pcVar14->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
                  pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar16 * -8 + 4)
                  ;
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar16 * -8 + 4);
                }
                iStack_378 = pcVar11->exp;
                bStack_374 = pcVar11->neg;
                local_370._0_4_ = pcVar11->fpclass;
                local_370._4_4_ = pcVar11->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_3e8,&vec[iVar5].m_backend);
            }
            pcVar11 = local_3f8;
            if ((fpclass_type)local_370 == cpp_dec_float_NaN) {
LAB_005d4a87:
              local_160._0_4_ = cpp_dec_float_finite;
              local_160._4_4_ = 0x1c;
              local_1d8 = (undefined1  [16])0x0;
              local_1c8 = (undefined1  [16])0x0;
              local_1b8 = (undefined1  [16])0x0;
              local_1a8 = (undefined1  [16])0x0;
              local_198 = (undefined1  [16])0x0;
              local_188 = (undefined1  [16])0x0;
              local_178 = SUB1613((undefined1  [16])0x0,0);
              uStack_16b = 0;
              iStack_168 = 0;
              bStack_164 = false;
              pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
              if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar11) {
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
                for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                  (pcVar14->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
                  pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar16 * -8 + 4)
                  ;
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar16 * -8 + 4);
                }
                iStack_168 = iStack_378;
                bStack_164 = bStack_374;
                local_160._0_4_ = (fpclass_type)local_370;
                local_160._4_4_ = local_370._4_4_;
                pcVar7 = pcVar11;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar7);
              pcVar7 = &local_b0;
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
              pcVar14 = pcVar7;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_b0.exp = iStack_168;
              local_b0.neg = bStack_164;
              local_b0.fpclass = (fpclass_type)local_160;
              local_b0.prec_elem = local_160._4_4_;
              bVar3 = bStack_164;
              if ((fpclass_type)local_160 == cpp_dec_float_finite && local_b0.data._M_elems[0] == 0)
              goto LAB_005d4882;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_488,0,(type *)0x0);
              iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_3e8,
                                 (cpp_dec_float<200U,_int,_void> *)local_488);
              if (0 < iVar4) goto LAB_005d4a87;
              pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_258;
              pcVar14 = pcVar7;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar16 * -8 + 4)
                ;
              }
              iStack_1e8 = (this->
                           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).fastDelta.m_backend.exp;
              bVar3 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).fastDelta.m_backend.neg;
              abStack_1e4._4_4_ =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.fpclass;
              abStack_1e4._8_4_ =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.prec_elem;
              abStack_1e4[0] = (bool)bVar3;
              if (abStack_1e4._4_4_ == cpp_dec_float_finite && local_258._0_4_ == 0)
              goto LAB_005d4882;
            }
            pcVar7->neg = (bool)(bVar3 ^ 1);
            goto LAB_005d4882;
          }
        }
      }
      else {
        ::soplex::infinity::__tls_init();
        pcVar11 = &low[iVar5].m_backend;
        local_410._0_4_ = cpp_dec_float_finite;
        local_410._4_4_ = 0x1c;
        local_488._0_16_ = (undefined1  [16])0x0;
        local_488._16_16_ = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        local_448 = (undefined1  [16])0x0;
        local_438 = (undefined1  [16])0x0;
        local_428 = SUB1613((undefined1  [16])0x0,0);
        uStack_41b = 0;
        iStack_418 = 0;
        bStack_414 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_488,local_148);
        if (((pcVar11->fpclass == cpp_dec_float_NaN) ||
            ((fpclass_type)local_410 == cpp_dec_float_NaN)) ||
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar11,(cpp_dec_float<200U,_int,_void> *)local_488), iVar4 < 1))
        goto LAB_005d49bf;
        local_370._0_4_ = cpp_dec_float_finite;
        local_370._4_4_ = 0x1c;
        local_3e8 = (undefined1  [16])0x0;
        local_3d8 = (undefined1  [16])0x0;
        local_3c8 = (undefined1  [16])0x0;
        local_3b8 = (undefined1  [16])0x0;
        local_3a8 = (undefined1  [16])0x0;
        local_398 = (undefined1  [16])0x0;
        local_388 = SUB1613((undefined1  [16])0x0,0);
        uStack_37b = 0;
        iStack_378 = 0;
        bStack_374 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_3e8 == &vec[iVar5].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_3e8,pcVar11);
          if (local_3e8._0_4_ != 0 || (fpclass_type)local_370 != cpp_dec_float_finite) {
            bStack_374 = (bool)(bStack_374 ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<200U,_int,_void> *)local_3e8 != pcVar11) {
            pcVar7 = pcVar11;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pcVar14->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
              pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar16 * -8 + 4);
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar16 * -8 + 4);
            }
            iStack_378 = pcVar11->exp;
            bStack_374 = pcVar11->neg;
            local_370._0_4_ = pcVar11->fpclass;
            local_370._4_4_ = pcVar11->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_3e8,&vec[iVar5].m_backend);
        }
        pcVar11 = local_3f8;
        if ((fpclass_type)local_370 != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_488,0,(type *)0x0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_3e8,
                             (cpp_dec_float<200U,_int,_void> *)local_488);
          pcVar7 = pcVar11;
          if (-1 < iVar4) goto LAB_005d4882;
        }
        abStack_1e4._4_8_ = 0x1c00000000;
        local_258 = (undefined1  [16])0x0;
        local_248 = (undefined1  [16])0x0;
        local_238 = (undefined1  [16])0x0;
        local_228 = (undefined1  [16])0x0;
        local_218 = (undefined1  [16])0x0;
        local_208 = (undefined1  [16])0x0;
        local_1f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_1eb = 0;
        iStack_1e8 = 0;
        abStack_1e4[0] = false;
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_258;
        if (pcVar7 != pcVar11) {
          pcVar14 = pcVar7;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar16 * -8 + 4);
          }
          iStack_1e8 = (this->
                       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).fastDelta.m_backend.exp;
          abStack_1e4[0] =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.neg;
          abStack_1e4._4_4_ =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.fpclass;
          abStack_1e4._8_4_ =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (pcVar7,(cpp_dec_float<200U,_int,_void> *)local_3e8);
LAB_005d4882:
        bStack_414 = false;
        iStack_418 = 0;
        uStack_41b = 0;
        local_428 = SUB1613((undefined1  [16])0x0,0);
        local_410._0_4_ = cpp_dec_float_finite;
        local_410._4_4_ = 0x1c;
        local_438 = (undefined1  [16])0x0;
        local_448 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_488._16_16_ = (undefined1  [16])0x0;
        local_488._0_16_ = (undefined1  [16])0x0;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_488,pcVar7,&local_130);
        puVar10 = (undefined4 *)local_488;
        puVar13 = (undefined4 *)local_368;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar13 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
          puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
        }
        iStack_2f8 = iStack_418;
        bStack_2f4 = bStack_414;
        local_2f0._0_4_ = (fpclass_type)local_410;
        local_2f0._4_4_ = local_410._4_4_;
        uVar2 = local_2f0;
        pBVar1 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar1[*nBp].idx = iVar5;
        iVar5 = *nBp;
        pBVar1[iVar5].src = src;
        puVar10 = (undefined4 *)local_368;
        pBVar8 = pBVar1 + iVar5;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined4 *)&(pBVar8->val).m_backend = *puVar10;
          puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
          pBVar8 = (pointer)((long)pBVar8 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        *(int *)((long)&pBVar1[iVar5].val.m_backend + 0x70) = iStack_418;
        *(bool *)((long)&pBVar1[iVar5].val.m_backend + 0x74) = bStack_414;
        *(undefined8 *)((long)&pBVar1[iVar5].val.m_backend + 0x78) = local_410;
        local_2f0._0_4_ = (fpclass_type)local_410;
        bVar15 = (fpclass_type)local_2f0 != cpp_dec_float_NaN;
        local_2f0 = uVar2;
        if (((bVar15) && ((fpclass_type)local_260 != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_368,
                               (cpp_dec_float<200U,_int,_void> *)local_2d8), iVar5 < 0)) {
          puVar10 = (undefined4 *)local_368;
          puVar13 = (undefined4 *)local_2d8;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar13 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
          }
          iStack_268 = iStack_2f8;
          bStack_264 = bStack_2f4;
          local_260._0_4_ = (fpclass_type)local_2f0;
          local_260._4_4_ = local_2f0._4_4_;
          *local_400 = *nBp;
        }
        *nBp = *nBp + 1;
      }
LAB_005d49bf:
      iVar5 = *nBp;
      iVar4 = (int)((ulong)((long)(this->breakpoints).data.
                                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (SBORROW4(iVar5,iVar4 * -0xf0f0f0f) == iVar5 + iVar4 * 0xf0f0f0f < 0) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&local_2e8->data,(long)iVar5 * 2);
      }
      idx = idx + 1;
    } while (idx < local_2e0);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}